

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMesh::GetFaceCenterPointAndNormal(ON_SubDMesh *this,ON_SubDFace *face,double *P,double *N)

{
  bool bVar1;
  uint uVar2;
  ON_SubDMeshFragment *this_00;
  double *pdVar3;
  double *pdVar4;
  uint local_5c;
  double *fragment_N;
  double *fragment_P;
  uint P_dex;
  uint n;
  ON_SubDMeshFragment *fragment;
  double *N_local;
  double *P_local;
  ON_SubDFace *face_local;
  ON_SubDMesh *this_local;
  
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  this_00 = FaceFragment(this,face);
  if (this_00 == (ON_SubDMeshFragment *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this_00->m_P == (double *)0x0) || (this_00->m_N == (double *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (uint)(this_00->m_grid).m_side_segment_count;
    bVar1 = ON_SubDMeshFragment::IsFullFaceFragment(this_00);
    if (bVar1) {
      local_5c = uVar2 * (uVar2 + 2) >> 1;
    }
    else {
      local_5c = 0;
    }
    uVar2 = ON_SubDMeshFragment::PointCount(this_00);
    if (local_5c < uVar2) {
      pdVar3 = this_00->m_P + (ulong)local_5c * this_00->m_P_stride;
      pdVar4 = this_00->m_N + (ulong)local_5c * this_00->m_N_stride;
      if (P != (double *)0x0) {
        *P = *pdVar3;
        P[1] = pdVar3[1];
        P[2] = pdVar3[2];
      }
      if (N != (double *)0x0) {
        *N = *pdVar4;
        N[1] = pdVar4[1];
        N[2] = pdVar4[2];
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMesh::GetFaceCenterPointAndNormal(
  const class ON_SubDFace* face,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  const ON_SubDMeshFragment* fragment = FaceFragment(face);
  if (nullptr == fragment)
    return false;
  if (nullptr == fragment->m_P || nullptr == fragment->m_N)
    return false;
  const unsigned int n = fragment->m_grid.m_side_segment_count;
  const unsigned int P_dex = fragment->IsFullFaceFragment() ? (n*(n + 2) / 2) : 0;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}